

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_get_specialization_constants
          (spvc_compiler compiler,spvc_specialization_constant **constants,size_t *num_constants)

{
  spvc_context psVar1;
  pointer this;
  size_t sVar2;
  SpecializationConstant *pSVar3;
  pointer pTVar4;
  spvc_specialization_constant *psVar5;
  exception *e;
  unique_ptr<TemporaryBuffer<spvc_specialization_constant>,_std::default_delete<TemporaryBuffer<spvc_specialization_constant>_>_>
  local_118;
  unique_ptr<TemporaryBuffer<spvc_specialization_constant>,_std::default_delete<TemporaryBuffer<spvc_specialization_constant>_>_>
  ptr;
  spvc_specialization_constant trans;
  SpecializationConstant *c;
  SpecializationConstant *__end1;
  SpecializationConstant *__begin1;
  SmallVector<spirv_cross::SpecializationConstant,_8UL> *__range1;
  SmallVector<spvc_specialization_constant,_8UL> translated;
  undefined1 local_80 [8];
  SmallVector<spirv_cross::SpecializationConstant,_8UL> spec_constants;
  size_t *num_constants_local;
  spvc_specialization_constant **constants_local;
  spvc_compiler compiler_local;
  
  spec_constants.stack_storage.aligned_char._56_8_ = num_constants;
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  spirv_cross::Compiler::get_specialization_constants
            ((SmallVector<spirv_cross::SpecializationConstant,_8UL> *)local_80,this);
  spirv_cross::SmallVector<spvc_specialization_constant,_8UL>::SmallVector
            ((SmallVector<spvc_specialization_constant,_8UL> *)&__range1);
  sVar2 = spirv_cross::VectorView<spirv_cross::SpecializationConstant>::size
                    ((VectorView<spirv_cross::SpecializationConstant> *)local_80);
  spirv_cross::SmallVector<spvc_specialization_constant,_8UL>::reserve
            ((SmallVector<spvc_specialization_constant,_8UL> *)&__range1,sVar2);
  __end1 = spirv_cross::VectorView<spirv_cross::SpecializationConstant>::begin
                     ((VectorView<spirv_cross::SpecializationConstant> *)local_80);
  pSVar3 = spirv_cross::VectorView<spirv_cross::SpecializationConstant>::end
                     ((VectorView<spirv_cross::SpecializationConstant> *)local_80);
  for (; __end1 != pSVar3; __end1 = __end1 + 1) {
    ptr._M_t.
    super___uniq_ptr_impl<TemporaryBuffer<spvc_specialization_constant>,_std::default_delete<TemporaryBuffer<spvc_specialization_constant>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_TemporaryBuffer<spvc_specialization_constant>_*,_std::default_delete<TemporaryBuffer<spvc_specialization_constant>_>_>
    .super__Head_base<0UL,_TemporaryBuffer<spvc_specialization_constant>_*,_false>._M_head_impl.
    _0_4_ = spirv_cross::TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    ptr._M_t.
    super___uniq_ptr_impl<TemporaryBuffer<spvc_specialization_constant>,_std::default_delete<TemporaryBuffer<spvc_specialization_constant>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_TemporaryBuffer<spvc_specialization_constant>_*,_std::default_delete<TemporaryBuffer<spvc_specialization_constant>_>_>
    .super__Head_base<0UL,_TemporaryBuffer<spvc_specialization_constant>_*,_false>._M_head_impl.
    _4_4_ = __end1->constant_id;
    spirv_cross::SmallVector<spvc_specialization_constant,_8UL>::push_back
              ((SmallVector<spvc_specialization_constant,_8UL> *)&__range1,
               (spvc_specialization_constant *)&ptr);
  }
  spvc_allocate<TemporaryBuffer<spvc_specialization_constant>>();
  pTVar4 = std::
           unique_ptr<TemporaryBuffer<spvc_specialization_constant>,_std::default_delete<TemporaryBuffer<spvc_specialization_constant>_>_>
           ::operator->(&local_118);
  spirv_cross::SmallVector<spvc_specialization_constant,_8UL>::operator=
            (&pTVar4->buffer,(SmallVector<spvc_specialization_constant,_8UL> *)&__range1);
  pTVar4 = std::
           unique_ptr<TemporaryBuffer<spvc_specialization_constant>,_std::default_delete<TemporaryBuffer<spvc_specialization_constant>_>_>
           ::operator->(&local_118);
  psVar5 = spirv_cross::VectorView<spvc_specialization_constant>::data
                     (&(pTVar4->buffer).super_VectorView<spvc_specialization_constant>);
  *constants = psVar5;
  pTVar4 = std::
           unique_ptr<TemporaryBuffer<spvc_specialization_constant>,_std::default_delete<TemporaryBuffer<spvc_specialization_constant>_>_>
           ::operator->(&local_118);
  sVar2 = spirv_cross::VectorView<spvc_specialization_constant>::size
                    (&(pTVar4->buffer).super_VectorView<spvc_specialization_constant>);
  *(size_t *)spec_constants.stack_storage.aligned_char._56_8_ = sVar2;
  psVar1 = compiler->context;
  std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>::
  unique_ptr<TemporaryBuffer<spvc_specialization_constant>,std::default_delete<TemporaryBuffer<spvc_specialization_constant>>,void>
            ((unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>> *)&e,
             &local_118);
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::push_back(&psVar1->allocations,
              (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &e);
  std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>::
  ~unique_ptr((unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &e);
  std::
  unique_ptr<TemporaryBuffer<spvc_specialization_constant>,_std::default_delete<TemporaryBuffer<spvc_specialization_constant>_>_>
  ::~unique_ptr(&local_118);
  spirv_cross::SmallVector<spvc_specialization_constant,_8UL>::~SmallVector
            ((SmallVector<spvc_specialization_constant,_8UL> *)&__range1);
  spirv_cross::SmallVector<spirv_cross::SpecializationConstant,_8UL>::~SmallVector
            ((SmallVector<spirv_cross::SpecializationConstant,_8UL> *)local_80);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_specialization_constants(spvc_compiler compiler,
                                                       const spvc_specialization_constant **constants,
                                                       size_t *num_constants)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto spec_constants = compiler->compiler->get_specialization_constants();
		SmallVector<spvc_specialization_constant> translated;
		translated.reserve(spec_constants.size());
		for (auto &c : spec_constants)
		{
			spvc_specialization_constant trans = { c.id, c.constant_id };
			translated.push_back(trans);
		}

		auto ptr = spvc_allocate<TemporaryBuffer<spvc_specialization_constant>>();
		ptr->buffer = std::move(translated);
		*constants = ptr->buffer.data();
		*num_constants = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}